

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O3

void __thiscall
ON_Brep::Internal_AttachV5RegionTopologyAsUserData(ON_Brep *this,ON_BinaryArchive *archive)

{
  int iVar1;
  ON_V5_BrepRegionTopologyUserData *this_00;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if ((((iVar1 == 0x32) && (this->m_region_topology != (ON_BrepRegionTopology *)0x0)) &&
      (iVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
               m_count, iVar1 != 0)) &&
     ((this->m_region_topology->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
      super_ON_ClassArray<ON_BrepFaceSide>.m_count == iVar1 * 2)) {
    this_00 = (ON_V5_BrepRegionTopologyUserData *)operator_new(0xd8);
    ON_V5_BrepRegionTopologyUserData::ON_V5_BrepRegionTopologyUserData(this_00);
    this_00->m_write_region_topology_ptr = this->m_region_topology;
    ON_Object::AttachUserData((ON_Object *)this,(ON_UserData *)this_00);
    return;
  }
  return;
}

Assistant:

void ON_Brep::Internal_AttachV5RegionTopologyAsUserData(
  ON_BinaryArchive& archive
) const
{
  if ( archive.Archive3dmVersion() != 50 )
    return;

  const bool bWriteRegionTopology
    = (nullptr != m_region_topology)
    && (m_F.UnsignedCount() > 0)
    && (m_region_topology->m_FS.UnsignedCount() == 2 * m_F.UnsignedCount());

  if ( false == bWriteRegionTopology )
    return;

  ON_V5_BrepRegionTopologyUserData* ud = new ON_V5_BrepRegionTopologyUserData();
  ud->m_write_region_topology_ptr = m_region_topology;
  const_cast<ON_Brep*>(this)->AttachUserData(ud);
}